

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool pegmatite::parse(Input *i,Rule *g,Rule *ws,ErrorReporter *err,ParserDelegate *delegate,void *d)

{
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
  *p_Var1;
  __node_base this;
  bool bVar2;
  __node_ptr __n;
  Context con;
  undefined4 *local_160;
  undefined8 local_158;
  undefined4 local_150;
  undefined4 uStack_14c;
  Context local_140;
  
  Context::Context(&local_140,i,ws,delegate);
  Context::parse_rule(&local_140,local_140.whitespace_rule,
                      (offset_in_Context_to_subr)Context::_parse_term);
  bVar2 = Context::parse_rule(&local_140,g,(offset_in_Context_to_subr)Context::_parse_non_term);
  if (bVar2) {
    Context::parse_rule(&local_140,local_140.whitespace_rule,
                        (offset_in_Context_to_subr)Context::_parse_term);
    if ((local_140.position.it.buffer == local_140.finish.buffer) &&
       (__n = (__node_ptr)local_140.whitespace_rule,
       local_140.position.it.idx == local_140.finish.idx)) {
      while ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
              *)local_140.cache._M_h._M_before_begin._M_nxt !=
             (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
              *)0x0) {
        p_Var1 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
                   **)local_140.cache._M_h._M_before_begin._M_nxt;
        std::__detail::
        _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
        ::_M_deallocate_node
                  ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
                    *)local_140.cache._M_h._M_before_begin._M_nxt,__n);
        local_140.cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var1;
      }
      memset(local_140.cache._M_h._M_buckets,0,local_140.cache._M_h._M_bucket_count << 3);
      local_140.cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_140.cache._M_h._M_element_count = 0;
      bVar2 = Context::do_parse_procs(&local_140,d);
      this._M_nxt = local_140.cache._M_h._M_before_begin._M_nxt;
      goto joined_r0x0012ac26;
    }
    if (local_140.error_pos.it.idx < local_140.finish.idx) goto LAB_0012ac09;
    InputRange::InputRange
              ((InputRange *)&stack0xffffffffffffffb0,&local_140.error_pos,&local_140.error_pos);
    local_150 = 0x464f45;
    local_158 = 3;
    local_160 = &local_150;
    if (*(long *)(err + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    d = &stack0xffffffffffffffb0;
    (**(code **)(err + 0x18))(err,d,&local_160);
    if (local_160 != &local_150) {
      d = (void *)(CONCAT44(uStack_14c,local_150) + 1);
      operator_delete(local_160,(ulong)d);
    }
  }
  else {
LAB_0012ac09:
    d = &local_140;
    _syntax_Error(err,(Context *)d);
  }
  bVar2 = false;
  this._M_nxt = local_140.cache._M_h._M_before_begin._M_nxt;
joined_r0x0012ac26:
  while ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
          *)this._M_nxt !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
          *)0x0) {
    p_Var1 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
               **)this._M_nxt;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
    ::_M_deallocate_node
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>_>_>
                *)this._M_nxt,(__node_ptr)d);
    this._M_nxt = (_Hash_node_base *)p_Var1;
  }
  memset(local_140.cache._M_h._M_buckets,0,local_140.cache._M_h._M_bucket_count << 3);
  local_140.cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_140.cache._M_h._M_element_count = 0;
  if (&local_140.cache._M_h._M_single_bucket != local_140.cache._M_h._M_buckets) {
    operator_delete(local_140.cache._M_h._M_buckets,local_140.cache._M_h._M_bucket_count << 3);
  }
  std::
  _Hashtable<const_pegmatite::Rule_*,_std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_pegmatite::Rule_*>,_std::hash<const_pegmatite::Rule_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_140.rule_states._M_h);
  if (local_140.matches.
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.matches.
                    super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.matches.
                          super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.matches.
                          super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool parse(Input &i, const Rule &g, const Rule &ws, ErrorReporter &err,
           const ParserDelegate &delegate, void *d)
{
	//prepare context
	Context con(i, ws, delegate);

	//parse initial whitespace
	con.parse_term(con.whitespace_rule);

	//parse grammar
	if (!con.parse_non_term(g))
	{
		_syntax_Error(err, con);
		return false;
	}

	//parse whitespace at the end
	con.parse_term(con.whitespace_rule);

	//if end is not reached, there was an error
	if (!con.end())
	{
		if (con.error_pos.it < con.finish)
		{
			_syntax_Error(err, con);
		}
		else
		{
			_eof_Error(err, con);
		}
		return false;
	}

	con.clear_cache();

	//success; execute the parse procedures
	return con.do_parse_procs(d);
}